

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putcold.c
# Opt level: O2

int ffr8fi8(double *input,long ntodo,double scale,double zero,LONGLONG *output,int *status)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  LONGLONG LVar4;
  double dVar5;
  
  if ((((scale != 1.0) || (NAN(scale))) || (zero != 9.223372036854776e+18)) || (NAN(zero))) {
    lVar2 = 0;
    if (0 < ntodo) {
      lVar2 = ntodo;
    }
    if (((scale != 1.0) || (NAN(scale))) || ((zero != 0.0 || (NAN(zero))))) {
      for (lVar1 = 0; lVar2 != lVar1; lVar1 = lVar1 + 1) {
        dVar5 = (input[lVar1] - zero) / scale;
        if (-9.223372036854776e+18 <= dVar5) {
          if (dVar5 <= 9.223372036854776e+18) {
            if (0.0 <= dVar5) {
              dVar5 = dVar5 + 0.5;
            }
            else {
              dVar5 = dVar5 + -0.5;
            }
            LVar4 = (LONGLONG)dVar5;
          }
          else {
            *status = -0xb;
            LVar4 = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          LVar4 = -0x8000000000000000;
        }
        output[lVar1] = LVar4;
      }
    }
    else {
      for (lVar1 = 0; lVar2 != lVar1; lVar1 = lVar1 + 1) {
        dVar5 = input[lVar1];
        if (-9.223372036854776e+18 <= dVar5) {
          if (dVar5 <= 9.223372036854776e+18) {
            LVar4 = (LONGLONG)dVar5;
          }
          else {
            *status = -0xb;
            LVar4 = 0x7fffffffffffffff;
          }
        }
        else {
          *status = -0xb;
          LVar4 = -0x8000000000000000;
        }
        output[lVar1] = LVar4;
      }
    }
  }
  else {
    lVar2 = 0;
    if (ntodo < 1) {
      ntodo = lVar2;
    }
    for (; ntodo != lVar2; lVar2 = lVar2 + 1) {
      dVar5 = input[lVar2];
      if (-0.49 <= dVar5) {
        if (dVar5 <= 1.8446744073709552e+19) {
          uVar3 = (long)dVar5 ^ 0x8000000000000000;
        }
        else {
          *status = -0xb;
          uVar3 = 0x7fffffffffffffff;
        }
      }
      else {
        *status = -0xb;
        uVar3 = 0x8000000000000000;
      }
      output[lVar2] = uVar3;
    }
  }
  return *status;
}

Assistant:

int ffr8fi8(double *input,     /* I - array of values to be converted  */
            long ntodo,        /* I - number of elements in the array  */
            double scale,      /* I - FITS TSCALn or BSCALE value      */
            double zero,       /* I - FITS TZEROn or BZERO  value      */
            LONGLONG *output,      /* O - output array of converted values */
            int *status)       /* IO - error status                    */
/*
  Copy input to output prior to writing output to a FITS file.
  Do datatype conversion and scaling if required.
*/
{
    long ii;
    double dvalue;

    if (scale == 1. && zero ==  9223372036854775808.)
    {       
        /* Writing to unsigned long long column. Input values must not be negative */
        /* Instead of subtracting 9223372036854775808, it is more efficient */
        /* and more precise to just flip the sign bit with the XOR operator */

        for (ii = 0; ii < ntodo; ii++) {
            if (input[ii] < -0.49) {
              *status = OVERFLOW_ERR;
              output[ii] = LONGLONG_MIN;
            }
	    else if (input[ii] > 2.* DLONGLONG_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MAX;
            } else {
              output[ii] =  ((LONGLONG) input[ii]) ^ 0x8000000000000000;
            }
        }
    }
    else if (scale == 1. && zero == 0.)
    {       
        for (ii = 0; ii < ntodo; ii++)
        {
            if (input[ii] < DLONGLONG_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MIN;
            }
            else if (input[ii] > DLONGLONG_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MAX;
            }
            else
                output[ii] = (LONGLONG) input[ii];
        }
    }
    else
    {
        for (ii = 0; ii < ntodo; ii++)
        {
            dvalue = (input[ii] - zero) / scale;

            if (dvalue < DLONGLONG_MIN)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MIN;
            }
            else if (dvalue > DLONGLONG_MAX)
            {
                *status = OVERFLOW_ERR;
                output[ii] = LONGLONG_MAX;
            }
            else
            {
                if (dvalue >= 0)
                    output[ii] = (LONGLONG) (dvalue + .5);
                else
                    output[ii] = (LONGLONG) (dvalue - .5);
            }
        }
    }
    return(*status);
}